

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxReporters.cpp
# Opt level: O3

void __thiscall
ApprovalTests::Linux::SublimeMergeReporter::SublimeMergeReporter(SublimeMergeReporter *this)

{
  SublimeMergeSnapReporter *this_00;
  SublimeMergeFlatpakReporter *this_01;
  SublimeMergeRepositoryPackageReporter *this_02;
  SublimeMergeDirectDownloadReporter *this_03;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_49;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_48;
  SublimeMergeSnapReporter *local_30;
  SublimeMergeFlatpakReporter *local_28;
  SublimeMergeRepositoryPackageReporter *local_20;
  SublimeMergeDirectDownloadReporter *local_18;
  
  this_00 = (SublimeMergeSnapReporter *)operator_new(0x70);
  SublimeMergeSnapReporter::SublimeMergeSnapReporter(this_00);
  local_30 = this_00;
  this_01 = (SublimeMergeFlatpakReporter *)operator_new(0x70);
  SublimeMergeFlatpakReporter::SublimeMergeFlatpakReporter(this_01);
  local_28 = this_01;
  this_02 = (SublimeMergeRepositoryPackageReporter *)operator_new(0x70);
  SublimeMergeRepositoryPackageReporter::SublimeMergeRepositoryPackageReporter(this_02);
  local_20 = this_02;
  this_03 = (SublimeMergeDirectDownloadReporter *)operator_new(0x70);
  SublimeMergeDirectDownloadReporter::SublimeMergeDirectDownloadReporter(this_03);
  __l._M_len = 4;
  __l._M_array = (iterator)&local_30;
  local_18 = this_03;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (&local_48,__l,&local_49);
  FirstWorkingReporter::FirstWorkingReporter(&this->super_FirstWorkingReporter,&local_48);
  if (local_48.
      super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_0017a060;
  return;
}

Assistant:

SublimeMergeReporter::SublimeMergeReporter()
            : FirstWorkingReporter({new SublimeMergeSnapReporter(),
                                    new SublimeMergeFlatpakReporter(),
                                    new SublimeMergeRepositoryPackageReporter(),
                                    new SublimeMergeDirectDownloadReporter()})
        {
        }